

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::TextureLevelCase::test
          (TextureLevelCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TesterType tester;
  GLenum pname;
  TestLog *pTVar3;
  bool bVar4;
  bool bVar5;
  GLenum GVar6;
  deUint32 dVar7;
  uint uVar8;
  long *plVar9;
  undefined8 *puVar10;
  ulong uVar11;
  size_type *psVar12;
  undefined8 uVar13;
  int iVar14;
  long lVar15;
  ScopedLogSection section;
  ScopedLogSection section_1;
  GLint ref;
  GLuint uRef;
  ScopedLogSection section_2;
  Random rnd;
  ScopedLogSection local_118;
  long local_110;
  TestLog local_108;
  long lStack_100;
  string local_f8;
  string local_d8;
  ulong *local_b8;
  long local_b0;
  ulong local_a8 [2];
  string local_98;
  ResultCollector *local_78;
  ScopedLogSection local_70;
  GLenum local_68;
  uint local_5c;
  float local_58;
  uint local_54;
  ScopedLogSection local_50;
  deRandom local_48;
  ulong local_38;
  
  tester = (this->super_TextureTest).m_tester;
  local_78 = result;
  bVar5 = isPureIntTester(tester);
  if (bVar5) {
    bVar4 = true;
  }
  else {
    bVar5 = isPureUintTester(tester);
    GVar6 = (this->super_TextureTest).m_pname;
    uVar8 = 0;
    if (GVar6 != 0x813c) {
      uVar8 = -(uint)(GVar6 != 0x813d) | 1000;
    }
    bVar4 = true;
    if (!bVar5) {
      pTVar3 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Initial","");
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Initial","");
      tcu::ScopedLogSection::ScopedLogSection(&local_118,pTVar3,&local_d8,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      StateQueryUtil::verifyStateTextureParamInteger
                (local_78,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                 uVar8,(this->super_TextureTest).m_type);
      tcu::TestLog::endSection(local_118.m_log);
      bVar4 = false;
    }
  }
  if (((this->super_TextureTest).m_target | 2) != 0x9102) {
    pTVar3 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Set","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Set","");
    tcu::ScopedLogSection::ScopedLogSection(&local_50,pTVar3,&local_d8,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    deRandom_init(&local_48,0xabcdef);
    if (bVar4) {
      iVar14 = 0x14;
      do {
        dVar7 = deRandom_getUint32(&local_48);
        local_5c = dVar7 % 0xfa01;
        local_54 = local_5c;
        bVar5 = isPureIntTester((this->super_TextureTest).m_tester);
        GVar6 = (this->super_TextureTest).m_target;
        pname = (this->super_TextureTest).m_pname;
        if (bVar5) {
          glu::CallLogWrapper::glTexParameterIiv(gl,GVar6,pname,(GLint *)&local_5c);
          GVar6 = glu::CallLogWrapper::glGetError(gl);
          if (GVar6 != 0) {
            local_b8 = local_a8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Got Error ","");
            local_70.m_log = (TestLog *)glu::getErrorName;
            local_68 = GVar6;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_98,&local_70);
            uVar11 = 0xf;
            if (local_b8 != local_a8) {
              uVar11 = local_a8[0];
            }
            if (uVar11 < local_98._M_string_length + local_b0) {
              uVar13 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                uVar13 = local_98.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar13 < local_98._M_string_length + local_b0) goto LAB_01830273;
              plVar9 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_98,0,(char *)0x0,(ulong)local_b8);
            }
            else {
LAB_01830273:
              plVar9 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_b8,(ulong)local_98._M_dataplus._M_p);
            }
            local_118.m_log = &local_108;
            pTVar3 = (TestLog *)(plVar9 + 2);
            if ((TestLog *)*plVar9 == pTVar3) {
              local_108.m_log = pTVar3->m_log;
              lStack_100 = plVar9[3];
            }
            else {
              local_108.m_log = pTVar3->m_log;
              local_118.m_log = (TestLog *)*plVar9;
            }
            local_110 = plVar9[1];
            *plVar9 = (long)pTVar3;
            plVar9[1] = 0;
            *(undefined1 *)&pTVar3->m_log = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_118);
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_f8.field_2._M_allocated_capacity = *psVar12;
              local_f8.field_2._8_8_ = plVar9[3];
            }
            else {
              local_f8.field_2._M_allocated_capacity = *psVar12;
              local_f8._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_f8._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_d8.field_2._M_allocated_capacity = *psVar12;
              local_d8.field_2._8_8_ = plVar9[3];
            }
            else {
              local_d8.field_2._M_allocated_capacity = *psVar12;
              local_d8._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_d8._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            tcu::ResultCollector::fail(local_78,&local_d8);
            goto LAB_01830585;
          }
        }
        else {
          glu::CallLogWrapper::glTexParameterIuiv(gl,GVar6,pname,&local_54);
          GVar6 = glu::CallLogWrapper::glGetError(gl);
          if (GVar6 == 0) goto LAB_01830619;
          local_b8 = local_a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Got Error ","");
          local_70.m_log = (TestLog *)glu::getErrorName;
          local_68 = GVar6;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_98,&local_70);
          uVar11 = 0xf;
          if (local_b8 != local_a8) {
            uVar11 = local_a8[0];
          }
          if (uVar11 < local_98._M_string_length + local_b0) {
            uVar13 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              uVar13 = local_98.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar13 < local_98._M_string_length + local_b0) goto LAB_01830349;
            plVar9 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_98,0,(char *)0x0,(ulong)local_b8);
          }
          else {
LAB_01830349:
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_b8,(ulong)local_98._M_dataplus._M_p);
          }
          local_118.m_log = &local_108;
          pTVar3 = (TestLog *)(plVar9 + 2);
          if ((TestLog *)*plVar9 == pTVar3) {
            local_108.m_log = pTVar3->m_log;
            lStack_100 = plVar9[3];
          }
          else {
            local_108.m_log = pTVar3->m_log;
            local_118.m_log = (TestLog *)*plVar9;
          }
          local_110 = plVar9[1];
          *plVar9 = (long)pTVar3;
          plVar9[1] = 0;
          *(undefined1 *)&pTVar3->m_log = 0;
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          psVar12 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_f8.field_2._M_allocated_capacity = *psVar12;
            local_f8.field_2._8_8_ = puVar10[3];
          }
          else {
            local_f8.field_2._M_allocated_capacity = *psVar12;
            local_f8._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_f8._M_string_length = puVar10[1];
          *puVar10 = psVar12;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_d8.field_2._M_allocated_capacity = *psVar12;
            local_d8.field_2._8_8_ = plVar9[3];
          }
          else {
            local_d8.field_2._M_allocated_capacity = *psVar12;
            local_d8._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_d8._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          tcu::ResultCollector::fail(local_78,&local_d8);
LAB_01830585:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if (local_118.m_log != &local_108) {
            operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if (local_b8 != local_a8) {
            operator_delete(local_b8,local_a8[0] + 1);
          }
        }
LAB_01830619:
        StateQueryUtil::verifyStateTextureParamInteger
                  (local_78,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   local_5c,(this->super_TextureTest).m_type);
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
    }
    else {
      iVar14 = 0x14;
      do {
        dVar7 = deRandom_getUint32(&local_48);
        glu::CallLogWrapper::glTexParameteri
                  (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   dVar7 % 0xfa01);
        GVar6 = glu::CallLogWrapper::glGetError(gl);
        if (GVar6 != 0) {
          local_b8 = local_a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Got Error ","");
          local_70.m_log = (TestLog *)glu::getErrorName;
          local_68 = GVar6;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_98,&local_70);
          uVar11 = 0xf;
          if (local_b8 != local_a8) {
            uVar11 = local_a8[0];
          }
          if (uVar11 < local_98._M_string_length + local_b0) {
            uVar13 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              uVar13 = local_98.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar13 < local_98._M_string_length + local_b0) goto LAB_01830753;
            plVar9 = (long *)std::__cxx11::string::replace
                                       ((ulong)&local_98,0,(char *)0x0,(ulong)local_b8);
          }
          else {
LAB_01830753:
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_b8,(ulong)local_98._M_dataplus._M_p);
          }
          local_118.m_log = &local_108;
          pTVar3 = (TestLog *)(plVar9 + 2);
          if ((TestLog *)*plVar9 == pTVar3) {
            local_108.m_log = pTVar3->m_log;
            lStack_100 = plVar9[3];
          }
          else {
            local_108.m_log = pTVar3->m_log;
            local_118.m_log = (TestLog *)*plVar9;
          }
          local_110 = plVar9[1];
          *plVar9 = (long)pTVar3;
          plVar9[1] = 0;
          *(undefined1 *)&pTVar3->m_log = 0;
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          psVar12 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_f8.field_2._M_allocated_capacity = *psVar12;
            local_f8.field_2._8_8_ = puVar10[3];
          }
          else {
            local_f8.field_2._M_allocated_capacity = *psVar12;
            local_f8._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_f8._M_string_length = puVar10[1];
          *puVar10 = psVar12;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          psVar12 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_d8.field_2._M_allocated_capacity = *psVar12;
            local_d8.field_2._8_8_ = plVar9[3];
          }
          else {
            local_d8.field_2._M_allocated_capacity = *psVar12;
            local_d8._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_d8._M_string_length = plVar9[1];
          *plVar9 = (long)psVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          tcu::ResultCollector::fail(local_78,&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if (local_118.m_log != &local_108) {
            operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if (local_b8 != local_a8) {
            operator_delete(local_b8,local_a8[0] + 1);
          }
        }
        StateQueryUtil::verifyStateTextureParamInteger
                  (local_78,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                   dVar7 % 0xfa01,(this->super_TextureTest).m_type);
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
      uVar11 = 0;
      do {
        local_38 = uVar11;
        dVar7 = deRandom_getUint32(&local_48);
        iVar14 = dVar7 % 64000 + 1;
        local_58 = (float)iVar14;
        lVar15 = 0;
        do {
          glu::CallLogWrapper::glTexParameterf
                    (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,
                     *(float *)((long)&DAT_01cad960 + lVar15) + local_58);
          GVar6 = glu::CallLogWrapper::glGetError(gl);
          if (GVar6 != 0) {
            local_b8 = local_a8;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Got Error ","");
            local_70.m_log = (TestLog *)glu::getErrorName;
            local_68 = GVar6;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_98,&local_70);
            uVar11 = 0xf;
            if (local_b8 != local_a8) {
              uVar11 = local_a8[0];
            }
            if (uVar11 < local_98._M_string_length + local_b0) {
              uVar13 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_98._M_dataplus._M_p != &local_98.field_2) {
                uVar13 = local_98.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar13 < local_98._M_string_length + local_b0) goto LAB_01830a56;
              plVar9 = (long *)std::__cxx11::string::replace
                                         ((ulong)&local_98,0,(char *)0x0,(ulong)local_b8);
            }
            else {
LAB_01830a56:
              plVar9 = (long *)std::__cxx11::string::_M_append
                                         ((char *)&local_b8,(ulong)local_98._M_dataplus._M_p);
            }
            local_118.m_log = &local_108;
            pTVar3 = (TestLog *)(plVar9 + 2);
            if ((TestLog *)*plVar9 == pTVar3) {
              local_108.m_log = pTVar3->m_log;
              lStack_100 = plVar9[3];
            }
            else {
              local_108.m_log = pTVar3->m_log;
              local_118.m_log = (TestLog *)*plVar9;
            }
            local_110 = plVar9[1];
            *plVar9 = (long)pTVar3;
            plVar9[1] = 0;
            *(undefined1 *)&pTVar3->m_log = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
            local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
            psVar12 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_f8.field_2._M_allocated_capacity = *psVar12;
              local_f8.field_2._8_8_ = puVar10[3];
            }
            else {
              local_f8.field_2._M_allocated_capacity = *psVar12;
              local_f8._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_f8._M_string_length = puVar10[1];
            *puVar10 = psVar12;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            psVar12 = (size_type *)(plVar9 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar12) {
              local_d8.field_2._M_allocated_capacity = *psVar12;
              local_d8.field_2._8_8_ = plVar9[3];
            }
            else {
              local_d8.field_2._M_allocated_capacity = *psVar12;
              local_d8._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_d8._M_string_length = plVar9[1];
            *plVar9 = (long)psVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            tcu::ResultCollector::fail(local_78,&local_d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            if (local_118.m_log != &local_108) {
              operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            if (local_b8 != local_a8) {
              operator_delete(local_b8,local_a8[0] + 1);
            }
          }
          StateQueryUtil::verifyStateTextureParamInteger
                    (local_78,gl,(this->super_TextureTest).m_target,
                     (this->super_TextureTest).m_pname,iVar14,(this->super_TextureTest).m_type);
          lVar15 = lVar15 + 4;
        } while (lVar15 != 0x10);
        uVar8 = (int)local_38 + 1;
        uVar11 = (ulong)uVar8;
      } while (uVar8 != 0x1e);
    }
    tcu::TestLog::endSection(local_50.m_log);
    return;
  }
  pTVar3 = ((this->super_TextureTest).super_TestCase.super_TestNode.m_testCtx)->m_log;
  paVar1 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"Set","");
  paVar2 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Set","");
  tcu::ScopedLogSection::ScopedLogSection(&local_70,pTVar3,&local_d8,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexParameteri
            (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0);
  GVar6 = glu::CallLogWrapper::glGetError(gl);
  if (GVar6 != 0) {
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Got Error ","");
    local_48._0_8_ = glu::getErrorName;
    local_48.z = GVar6;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_98,&local_48);
    uVar11 = 0xf;
    if (local_b8 != local_a8) {
      uVar11 = local_a8[0];
    }
    if (uVar11 < local_98._M_string_length + local_b0) {
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        uVar13 = local_98.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_98._M_string_length + local_b0) goto LAB_0183007f;
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_b8)
      ;
    }
    else {
LAB_0183007f:
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_b8,(ulong)local_98._M_dataplus._M_p);
    }
    local_118.m_log = &local_108;
    pTVar3 = (TestLog *)(plVar9 + 2);
    if ((TestLog *)*plVar9 == pTVar3) {
      local_108.m_log = pTVar3->m_log;
      lStack_100 = plVar9[3];
    }
    else {
      local_108.m_log = pTVar3->m_log;
      local_118.m_log = (TestLog *)*plVar9;
    }
    local_110 = plVar9[1];
    *plVar9 = (long)pTVar3;
    plVar9[1] = 0;
    *(undefined1 *)&pTVar3->m_log = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_118);
    psVar12 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_f8.field_2._M_allocated_capacity = *psVar12;
      local_f8.field_2._8_8_ = plVar9[3];
      local_f8._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_f8.field_2._M_allocated_capacity = *psVar12;
      local_f8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_f8._M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
    psVar12 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_d8.field_2._M_allocated_capacity = *psVar12;
      local_d8.field_2._8_8_ = plVar9[3];
      local_d8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d8.field_2._M_allocated_capacity = *psVar12;
      local_d8._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_d8._M_string_length = plVar9[1];
    *plVar9 = (long)psVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    tcu::ResultCollector::fail(local_78,&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar1) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_118.m_log != &local_108) {
      operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
  }
  StateQueryUtil::verifyStateTextureParamInteger
            (local_78,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0,
             (this->super_TextureTest).m_type);
  glu::CallLogWrapper::glTexParameterf
            (gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0.0);
  GVar6 = glu::CallLogWrapper::glGetError(gl);
  if (GVar6 == 0) goto LAB_01831061;
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Got Error ","");
  local_48._0_8_ = glu::getErrorName;
  local_48.z = GVar6;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_98,&local_48);
  uVar11 = 0xf;
  if (local_b8 != local_a8) {
    uVar11 = local_a8[0];
  }
  if (uVar11 < local_98._M_string_length + local_b0) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar13 = local_98.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_98._M_string_length + local_b0) goto LAB_01830ec7;
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_b8);
  }
  else {
LAB_01830ec7:
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_b8,(ulong)local_98._M_dataplus._M_p);
  }
  local_118.m_log = &local_108;
  pTVar3 = (TestLog *)(plVar9 + 2);
  if ((TestLog *)*plVar9 == pTVar3) {
    local_108.m_log = pTVar3->m_log;
    lStack_100 = plVar9[3];
  }
  else {
    local_108.m_log = pTVar3->m_log;
    local_118.m_log = (TestLog *)*plVar9;
  }
  local_110 = plVar9[1];
  *plVar9 = (long)pTVar3;
  plVar9[1] = 0;
  *(undefined1 *)&pTVar3->m_log = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_118);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_f8.field_2._M_allocated_capacity = *psVar12;
    local_f8.field_2._8_8_ = plVar9[3];
    local_f8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar12;
    local_f8._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_f8._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_f8);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_d8.field_2._M_allocated_capacity = *psVar12;
    local_d8.field_2._8_8_ = plVar9[3];
    local_d8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar12;
    local_d8._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_d8._M_string_length = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  tcu::ResultCollector::fail(local_78,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if (local_118.m_log != &local_108) {
    operator_delete(local_118.m_log,(ulong)((long)&(local_108.m_log)->flags + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
LAB_01831061:
  StateQueryUtil::verifyStateTextureParamInteger
            (local_78,gl,(this->super_TextureTest).m_target,(this->super_TextureTest).m_pname,0,
             (this->super_TextureTest).m_type);
  tcu::TestLog::endSection(local_70.m_log);
  return;
}

Assistant:

void TextureLevelCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool	isPureCase		= isPureIntTester(m_tester) || isPureUintTester(m_tester);
	const int	initialValue	= (m_pname == GL_TEXTURE_BASE_LEVEL) ? (0)
								: (m_pname == GL_TEXTURE_MAX_LEVEL)	? (1000)
								: (-1);

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateTextureParamInteger(result, gl, m_target, m_pname, initialValue, m_type);
	}

	if (m_target == GL_TEXTURE_2D_MULTISAMPLE		||
		m_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		// only 0 allowed
		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "Set", "Set");

			gl.glTexParameteri(m_target, m_pname, 0);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameteri");
			verifyStateTextureParamInteger(result, gl, m_target, m_pname, 0, m_type);

			gl.glTexParameterf(m_target, m_pname, 0.0f);
			GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterf");
			verifyStateTextureParamInteger(result, gl, m_target, m_pname, 0, m_type);
		}
	}
	else
	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const int					numIterations	= 20;
		de::Random					rnd				(0xabcdef);

		if (isPureCase)
		{
			for (int ndx = 0; ndx < numIterations; ++ndx)
			{
				const GLint		ref		= rnd.getInt(0, 64000);
				const GLuint	uRef	= (glw::GLuint)ref;

				if (isPureIntTester(m_tester))
				{
					gl.glTexParameterIiv(m_target, m_pname, &ref);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIiv");
				}
				else
				{
					DE_ASSERT(isPureUintTester(m_tester));
					gl.glTexParameterIuiv(m_target, m_pname, &uRef);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterIuiv");
				}

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, ref, m_type);
			}
		}
		else
		{
			for (int ndx = 0; ndx < numIterations; ++ndx)
			{
				const GLint ref = rnd.getInt(0, 64000);

				gl.glTexParameteri(m_target, m_pname, ref);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameteri");

				verifyStateTextureParamInteger(result, gl, m_target, m_pname, ref, m_type);
			}

			// check unit conversions with float

			const float nonSignificantOffsets[] = {-0.45f, -0.25f, 0, 0.45f}; // offsets O so that for any integers z in Z, o in O roundToClosestInt(z+o)==z

			const int numConversionIterations = 30;
			for (int ndx = 0; ndx < numConversionIterations; ++ndx)
			{
				const GLint ref = rnd.getInt(1, 64000);

				for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(nonSignificantOffsets); ++offsetNdx)
				{
					gl.glTexParameterf(m_target, m_pname, ((GLfloat)ref) + nonSignificantOffsets[offsetNdx]);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glTexParameterf");

					verifyStateTextureParamInteger(result, gl, m_target, m_pname, ref, m_type);
				}
			}
		}
	}
}